

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_internal.c
# Opt level: O0

int mbedtls_rsa_validate_crt
              (mbedtls_mpi *P,mbedtls_mpi *Q,mbedtls_mpi *D,mbedtls_mpi *DP,mbedtls_mpi *DQ,
              mbedtls_mpi *QP)

{
  int iVar1;
  undefined1 local_70 [8];
  mbedtls_mpi L;
  mbedtls_mpi K;
  int ret;
  mbedtls_mpi *QP_local;
  mbedtls_mpi *DQ_local;
  mbedtls_mpi *DP_local;
  mbedtls_mpi *D_local;
  mbedtls_mpi *Q_local;
  mbedtls_mpi *P_local;
  
  K.p._4_4_ = 0;
  mbedtls_mpi_init((mbedtls_mpi *)&L.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_70);
  if (DP != (mbedtls_mpi *)0x0) {
    if (P == (mbedtls_mpi *)0x0) {
      K.p._4_4_ = -0x4080;
      goto LAB_00130e0e;
    }
    K.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&L.p,P,1);
    if (((K.p._4_4_ != 0) ||
        (K.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_70,DP,D), K.p._4_4_ != 0)) ||
       (K.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)local_70,(mbedtls_mpi *)local_70,
                                        (mbedtls_mpi *)&L.p), K.p._4_4_ != 0)) goto LAB_00130e0e;
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_70,0);
    if (iVar1 != 0) {
      K.p._4_4_ = -0x4200;
      goto LAB_00130e0e;
    }
  }
  if (DQ != (mbedtls_mpi *)0x0) {
    if (Q == (mbedtls_mpi *)0x0) {
      K.p._4_4_ = -0x4080;
      goto LAB_00130e0e;
    }
    K.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&L.p,Q,1);
    if (((K.p._4_4_ != 0) ||
        (K.p._4_4_ = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_70,DQ,D), K.p._4_4_ != 0)) ||
       (K.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)local_70,(mbedtls_mpi *)local_70,
                                        (mbedtls_mpi *)&L.p), K.p._4_4_ != 0)) goto LAB_00130e0e;
    iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_70,0);
    if (iVar1 != 0) {
      K.p._4_4_ = -0x4200;
      goto LAB_00130e0e;
    }
  }
  if (QP != (mbedtls_mpi *)0x0) {
    if ((P == (mbedtls_mpi *)0x0) || (Q == (mbedtls_mpi *)0x0)) {
      K.p._4_4_ = -0x4080;
    }
    else {
      K.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&L.p,QP,Q);
      if ((((K.p._4_4_ == 0) &&
           (K.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)&L.p,(mbedtls_mpi *)&L.p,1),
           K.p._4_4_ == 0)) &&
          (K.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&L.p,(mbedtls_mpi *)&L.p,P),
          K.p._4_4_ == 0)) && (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&L.p,0), iVar1 != 0)) {
        K.p._4_4_ = -0x4200;
      }
    }
  }
LAB_00130e0e:
  if (((K.p._4_4_ != 0) && (K.p._4_4_ != -0x4200)) && (K.p._4_4_ != -0x4080)) {
    K.p._4_4_ = K.p._4_4_ + -0x4200;
  }
  mbedtls_mpi_free((mbedtls_mpi *)&L.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_70);
  return K.p._4_4_;
}

Assistant:

int mbedtls_rsa_validate_crt( const mbedtls_mpi *P,  const mbedtls_mpi *Q,
                              const mbedtls_mpi *D,  const mbedtls_mpi *DP,
                              const mbedtls_mpi *DQ, const mbedtls_mpi *QP )
{
    int ret = 0;

    mbedtls_mpi K, L;
    mbedtls_mpi_init( &K );
    mbedtls_mpi_init( &L );

    /* Check that DP - D == 0 mod P - 1 */
    if( DP != NULL )
    {
        if( P == NULL )
        {
            ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, P, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &L, DP, D ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &L, &L, &K ) );

        if( mbedtls_mpi_cmp_int( &L, 0 ) != 0 )
        {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

    /* Check that DQ - D == 0 mod Q - 1 */
    if( DQ != NULL )
    {
        if( Q == NULL )
        {
            ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, Q, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &L, DQ, D ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &L, &L, &K ) );

        if( mbedtls_mpi_cmp_int( &L, 0 ) != 0 )
        {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

    /* Check that QP * Q - 1 == 0 mod P */
    if( QP != NULL )
    {
        if( P == NULL || Q == NULL )
        {
            ret = MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &K, QP, Q ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, &K, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &K, &K, P ) );
        if( mbedtls_mpi_cmp_int( &K, 0 ) != 0 )
        {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

cleanup:

    /* Wrap MPI error codes by RSA check failure error code */
    if( ret != 0 &&
        ret != MBEDTLS_ERR_RSA_KEY_CHECK_FAILED &&
        ret != MBEDTLS_ERR_RSA_BAD_INPUT_DATA )
    {
        ret += MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    mbedtls_mpi_free( &K );
    mbedtls_mpi_free( &L );

    return( ret );
}